

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::to_chars<double>(char *first,char *last,double value)

{
  bool bVar1;
  int kMaxExp;
  int kMinExp;
  int decimal_exponent;
  int len;
  double value_local;
  char *last_local;
  char *first_local;
  
  _decimal_exponent = value;
  value_local = (double)last;
  last_local = first;
  bVar1 = std::isfinite(value);
  if (!bVar1) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x2451,
                  "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                 );
  }
  bVar1 = std::signbit(_decimal_exponent);
  if (bVar1) {
    _decimal_exponent = -_decimal_exponent;
    *last_local = '-';
    last_local = last_local + 1;
  }
  if ((_decimal_exponent != 0.0) || (NAN(_decimal_exponent))) {
    if ((long)value_local - (long)last_local < 0x11) {
      __assert_fail("last - first >= std::numeric_limits<FloatType>::max_digits10",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x2462,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    kMinExp = 0;
    kMaxExp = 0;
    dtoa_impl::grisu2<double>(last_local,&kMinExp,&kMaxExp,_decimal_exponent);
    if (0x11 < kMinExp) {
      __assert_fail("len <= std::numeric_limits<FloatType>::max_digits10",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x246c,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    if ((long)value_local - (long)last_local < 0x11) {
      __assert_fail("last - first >= kMaxExp + 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x2473,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    if ((long)value_local - (long)last_local < 0x16) {
      __assert_fail("last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x2474,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    if ((long)value_local - (long)last_local < 0x17) {
      __assert_fail("last - first >= std::numeric_limits<FloatType>::max_digits10 + 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                    ,0x2475,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    first_local = dtoa_impl::format_buffer(last_local,kMinExp,kMaxExp,-4,0xf);
  }
  else {
    *last_local = '0';
    last_local[1] = '.';
    first_local = last_local + 3;
    last_local[2] = '0';
  }
  return first_local;
}

Assistant:

char* to_chars(char* first, const char* last, FloatType value) {
	static_cast<void>(last);  // maybe unused - fix warning
	assert(std::isfinite(value));

	// Use signbit(value) instead of (value < 0) since signbit works for -0.
	if (std::signbit(value)) {
		value = -value;
		*first++ = '-';
	}

	if (value == 0)  // +-0
	{
		*first++ = '0';
		// Make it look like a floating-point number (#362, #378)
		*first++ = '.';
		*first++ = '0';
		return first;
	}

	assert(last - first >= std::numeric_limits<FloatType>::max_digits10);

	// Compute v = buffer * 10^decimal_exponent.
	// The decimal digits are stored in the buffer, which needs to be interpreted
	// as an unsigned decimal integer.
	// len is the length of the buffer, i.e. the number of decimal digits.
	int len = 0;
	int decimal_exponent = 0;
	dtoa_impl::grisu2(first, len, decimal_exponent, value);

	assert(len <= std::numeric_limits<FloatType>::max_digits10);

	// Format the buffer like printf("%.*g", prec, value)
	constexpr int kMinExp = -4;
	// Use digits10 here to increase compatibility with version 2.
	constexpr int kMaxExp = std::numeric_limits<FloatType>::digits10;

	assert(last - first >= kMaxExp + 2);
	assert(last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10);
	assert(last - first >= std::numeric_limits<FloatType>::max_digits10 + 6);

	return dtoa_impl::format_buffer(first, len, decimal_exponent, kMinExp, kMaxExp);
}